

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphContigger.cc
# Opt level: O3

void __thiscall
GraphContigger::pop_all_error_bubbles
          (GraphContigger *this,GraphEditor *ge,PairedReadsDatastore *peds,int size,bool apply)

{
  ulong uVar1;
  bool bVar2;
  uint64_t uVar3;
  ostream *poVar4;
  GraphContigger *this_00;
  int iVar5;
  pointer this_01;
  ulong uVar6;
  ulong uVar7;
  int local_80;
  vector<NodeView,_std::allocator<NodeView>_> local_70;
  GraphContigger *local_58;
  PairedReadsDatastore *local_50;
  vector<NodeView,_std::allocator<NodeView>_> local_48;
  
  iVar5 = 0;
  local_58 = this;
  local_50 = peds;
  DistanceGraph::get_all_nodeviews(&local_48,*(DistanceGraph **)this,false,true);
  if (local_48.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_48.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_80 = 0;
  }
  else {
    local_80 = 0;
    iVar5 = 0;
    this_01 = local_48.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      uVar3 = NodeView::size(this_01);
      if ((uVar3 <= (ulong)(long)size) && (bVar2 = NodeView::is_bubble_side(this_01), bVar2)) {
        uVar1 = this_01->id;
        NodeView::parallels(&local_70,this_01);
        uVar6 = -uVar1;
        if (0 < (long)uVar1) {
          uVar6 = uVar1;
        }
        uVar1 = (local_70.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
                 super__Vector_impl_data._M_start)->id;
        uVar7 = -uVar1;
        if (0 < (long)uVar1) {
          uVar7 = uVar1;
        }
        operator_delete(local_70.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_70.super__Vector_base<NodeView,_std::allocator<NodeView>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_70.super__Vector_base<NodeView,_std::allocator<NodeView>_>.
                              _M_impl.super__Vector_impl_data._M_start);
        if (uVar6 < uVar7) {
          this_00 = (GraphContigger *)&local_70;
          NodeView::parallels((vector<NodeView,_std::allocator<NodeView>_> *)this_00,this_01);
          bVar2 = pop_error_bubbble(this_00,ge,this_01,
                                    local_70.super__Vector_base<NodeView,_std::allocator<NodeView>_>
                                    ._M_impl.super__Vector_impl_data._M_start,local_50,5,10,10,false
                                   );
          if (local_70.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
              super__Vector_impl_data._M_start != (NodeView *)0x0) {
            operator_delete(local_70.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl
                            .super__Vector_impl_data._M_start,
                            (long)local_70.super__Vector_base<NodeView,_std::allocator<NodeView>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_70.super__Vector_base<NodeView,_std::allocator<NodeView>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          local_80 = local_80 + 1;
          iVar5 = iVar5 + (uint)bVar2;
        }
      }
      this_01 = this_01 + 1;
    } while (this_01 !=
             local_48.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if (local_48.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
      super__Vector_impl_data._M_start != (NodeView *)0x0) {
    operator_delete(local_48.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  poVar4 = (ostream *)std::ostream::operator<<(&std::cout,iVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"/",1);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_80);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," canonical repeats solved!",0x1a);
  std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  if (apply) {
    GraphEditor::apply_all(ge);
    SequenceDistanceGraph::join_all_unitigs(*(SequenceDistanceGraph **)local_58);
  }
  return;
}

Assistant:

void GraphContigger::pop_all_error_bubbles(GraphEditor &ge, PairedReadsDatastore &peds, int size, bool apply){
    int total=0;
    int solved=0;
    for (auto &nv: ws.sdg.get_all_nodeviews()){
        if (nv.size()<=size and nv.is_bubble_side() and std::abs(nv.node_id())<std::abs(nv.parallels()[0].node_id())) {
            total++;
            if (pop_error_bubbble(ge, nv, nv.parallels()[0], peds)){
                solved++;
            }
        }
    }
    std::cout << solved << "/" << total << " canonical repeats solved!" << std::endl;
    if (apply) {
        ge.apply_all();
        ws.sdg.join_all_unitigs();
    }
}